

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

void __thiscall Console::Prompt::Private::promptClear(Private *this)

{
  usize *puVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  long lVar5;
  usize uVar6;
  ulong uVar7;
  String clearCmd_1;
  String clearCmd;
  String local_b0;
  String local_88;
  String local_60;
  ulong local_38;
  
  uVar4 = this->stdoutScreenWidth;
  lVar5 = (long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2;
  uVar7 = ((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) + lVar5;
  uVar2 = uVar7 / uVar4;
  if (uVar7 < uVar4) {
    local_88.data = (Data *)operator_new__(uVar7 + 0x2d);
    (local_88.data)->str = (char *)(local_88.data + 1);
    *(undefined1 *)&local_88.data[1].str = 0;
    (local_88.data)->len = 0;
    (local_88.data)->ref = 1;
    (local_88.data)->capacity = uVar7 + 0xc;
    local_b0._data.ref = 0;
    local_b0._data.str = "\x1b[?7l";
    local_b0._data.len = 5;
    local_b0.data = &local_b0._data;
    String::append(&local_88,&local_b0);
    if ((local_b0.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_b0.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_b0.data != (Data *)0x0)) {
        operator_delete__(local_b0.data);
      }
    }
    uVar6 = (local_88.data)->len + 1;
    String::detach(&local_88,(local_88.data)->len,uVar6);
    (local_88.data)->str[(local_88.data)->len] = '\r';
    (local_88.data)->len = uVar6;
    (local_88.data)->str[uVar6] = '\0';
    if (uVar7 != 0) {
      do {
        uVar6 = (local_88.data)->len + 1;
        String::detach(&local_88,(local_88.data)->len,uVar6);
        (local_88.data)->str[(local_88.data)->len] = ' ';
        (local_88.data)->len = uVar6;
        (local_88.data)->str[uVar6] = '\0';
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    uVar6 = (local_88.data)->len + 1;
    String::detach(&local_88,(local_88.data)->len,uVar6);
    (local_88.data)->str[(local_88.data)->len] = '\r';
    (local_88.data)->len = uVar6;
    (local_88.data)->str[uVar6] = '\0';
    local_b0._data.ref = 0;
    local_b0._data.str = "\x1b[?7h";
    local_b0._data.len = 5;
    local_b0.data = &local_b0._data;
    String::append(&local_88,&local_b0);
    if ((local_b0.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_b0.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_b0.data != (Data *)0x0)) {
        operator_delete__(local_b0.data);
      }
    }
    pbVar3 = (byte *)String::operator_cast_to_char_(&local_88);
    Buffer::append(&this->bufferedOutput,pbVar3,(local_88.data)->len);
  }
  else {
    uVar6 = lVar5 + this->caretPos;
    local_38 = uVar4;
    moveCursorPosition(this,uVar6,-uVar6);
    uVar6 = this->stdoutScreenWidth;
    local_88.data = (Data *)operator_new__(uVar6 + 0x23);
    (local_88.data)->str = (char *)(local_88.data + 1);
    *(undefined1 *)&local_88.data[1].str = 0;
    (local_88.data)->len = 0;
    (local_88.data)->ref = 1;
    (local_88.data)->capacity = uVar6 + 2;
    if (this->stdoutScreenWidth != 0) {
      uVar4 = 0;
      do {
        uVar6 = (local_88.data)->len + 1;
        String::detach(&local_88,(local_88.data)->len,uVar6);
        (local_88.data)->str[(local_88.data)->len] = ' ';
        (local_88.data)->len = uVar6;
        (local_88.data)->str[uVar6] = '\0';
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->stdoutScreenWidth);
    }
    local_b0.data = &local_b0._data;
    local_b0._data.ref = 0;
    local_b0._data.str = "\n\r";
    local_b0._data.len = 2;
    String::append(&local_88,&local_b0);
    if ((local_b0.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_b0.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_b0.data != (Data *)0x0)) {
        operator_delete__(local_b0.data);
      }
    }
    local_b0.data = (Data *)operator_new__(uVar7 + uVar2 * 2 + 0x2b);
    (local_b0.data)->str = (char *)(local_b0.data + 1);
    *(undefined1 *)&local_b0.data[1].str = 0;
    (local_b0.data)->len = 0;
    (local_b0.data)->ref = 1;
    (local_b0.data)->capacity = uVar7 + uVar2 * 2 + 10;
    local_60.data = &local_60._data;
    local_60._data.ref = 0;
    local_60._data.str = "\x1b[?7l";
    local_60._data.len = 5;
    String::append(&local_b0,&local_60);
    if ((local_60.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_60.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_60.data != (Data *)0x0)) {
        operator_delete__(local_60.data);
      }
    }
    if (local_38 <= uVar7) {
      uVar4 = 0;
      do {
        String::append(&local_b0,&local_88);
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar2);
    }
    uVar2 = uVar2 * this->stdoutScreenWidth;
    if (uVar7 != uVar2) {
      uVar4 = 0;
      do {
        uVar6 = (local_b0.data)->len + 1;
        String::detach(&local_b0,(local_b0.data)->len,uVar6);
        (local_b0.data)->str[(local_b0.data)->len] = ' ';
        (local_b0.data)->len = uVar6;
        (local_b0.data)->str[uVar6] = '\0';
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar7 - uVar2);
    }
    local_60.data = &local_60._data;
    local_60._data.ref = 0;
    local_60._data.str = "\x1b[?7h";
    local_60._data.len = 5;
    String::append(&local_b0,&local_60);
    if ((local_60.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_60.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_60.data != (Data *)0x0)) {
        operator_delete__(local_60.data);
      }
    }
    pbVar3 = (byte *)String::operator_cast_to_char_(&local_b0);
    Buffer::append(&this->bufferedOutput,pbVar3,(local_b0.data)->len);
    moveCursorPosition(this,((long)(this->input)._end.item - (long)(this->input)._begin.item >> 2) +
                            ((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2)
                       ,-uVar7);
    if ((local_b0.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_b0.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_b0.data != (Data *)0x0)) {
        operator_delete__(local_b0.data);
      }
    }
  }
  if ((local_88.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_88.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_88.data != (Data *)0x0)) {
      operator_delete__(local_88.data);
    }
  }
  return;
}

Assistant:

void promptClear()
  {
    usize bufferLen = prompt.size() + input.size();
    usize additionalLines = bufferLen / stdoutScreenWidth;
    if(additionalLines)
    {
      moveCursorPosition(prompt.size() + caretPos, -(ssize)(caretPos + prompt.size()));
      String clearLine(stdoutScreenWidth + 2);
      for(usize i = 0; i < stdoutScreenWidth; ++i)
        clearLine.append(' ');
      clearLine.append("\n\r");
      String clearCmd(bufferLen + additionalLines * 2
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      for(usize i = 0; i < additionalLines; ++i)
        clearCmd.append(clearLine);
      for(usize i = 0, count = bufferLen - additionalLines * stdoutScreenWidth; i < count; ++i)
        clearCmd.append(' ');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
      moveCursorPosition(prompt.size() + input.size(), -(ssize)bufferLen);
    }
    else
    {
      String clearCmd(2 + bufferLen
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      clearCmd.append('\r');
      for(usize i = 0, count = bufferLen; i < count; ++i)
        clearCmd.append(' ');
      clearCmd.append('\r');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
    }
  }